

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

string * __thiscall
ritobin::io::read_text_abi_cxx11_
          (string *__return_storage_ptr__,io *this,ElementList *list,Type valueType,
          span<const_char,_18446744073709551615UL> data)

{
  bool bVar1;
  undefined7 in_register_00000009;
  BinTextReader local_40;
  
  local_40.reader.cap_ = data._M_ptr + CONCAT71(in_register_00000009,valueType);
  local_40.reader.beg_ = (char *)CONCAT71(in_register_00000009,valueType);
  local_40.reader.cur_ = (char *)CONCAT71(in_register_00000009,valueType);
  local_40.error.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.error.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.error.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = impl_text_read::BinTextReader::process_list_elements
                    (&local_40,(ElementList *)this,(Type)list);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    impl_text_read::BinTextReader::trace_error_abi_cxx11_(__return_storage_ptr__,&local_40);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector(&local_40.error);
  return __return_storage_ptr__;
}

Assistant:

std::string read_text(ElementList& list, Type valueType, std::span<char const> data) noexcept {
        auto const begin = data.data();
        auto const end = data.data() + data.size();
        BinTextReader reader = { { begin, begin, end }, {} };
        if (!reader.process_list_elements(list, valueType)) {
            return reader.trace_error();
        }
        return {};
    }